

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  ulong uVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  
  r = this->_cursor;
  while (pMVar1 = this->_stack, r != pMVar1) {
    r = r + -1;
    mpz_clear((__mpz_struct *)r);
  }
  if (pMVar1 != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar2 = this->_capacity << 5;
    if (uVar2 == 0) {
      (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar1;
    }
    else if (uVar2 < 0x21) {
      (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar1;
    }
    else if (uVar2 < 0x31) {
      (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(pMVar1,0x10);
        return;
      }
      (pMVar1->numeral)._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (pMVar1->numeral)._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }